

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,StackVar *sv)

{
  pointer pTVar1;
  char __lhs;
  iterator iVar2;
  ulong uVar3;
  _Rb_tree_header *p_Var4;
  char *in_R8;
  uint __val;
  ulong uVar5;
  Type type;
  string_view proposed_name;
  string_view name_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar6;
  StackTypePair stp;
  string name;
  string local_c0;
  string local_a0;
  string local_80;
  key_type local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar1 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3;
  uVar5 = ~(ulong)sv->index + uVar3;
  type = sv->type;
  __val = (uint)uVar5;
  if (type.enum_ == Any) {
    uVar5 = uVar5 & 0xffffffff;
    if (uVar3 <= uVar5) {
      __assert_fail("index < type_stack_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x4bd,"void wabt::(anonymous namespace)::CWriter::Write(const StackVar &)");
    }
    type = pTVar1[uVar5];
  }
  local_5c.first = __val;
  local_5c.second = type;
  iVar2 = std::
          _Rb_tree<std::pair<unsigned_int,_wabt::Type>,_std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->stack_var_sym_map_)._M_t,&local_5c);
  p_Var4 = &(this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node == p_Var4) {
    __lhs = MangleType(type);
    std::__cxx11::to_string(&local_80,__val);
    std::operator+(&local_50,__lhs,&local_80);
    std::__cxx11::string::_M_dispose();
    name_00._M_str = (char *)p_Var4;
    name_00._M_len = (size_t)local_50._M_dataplus._M_p;
    (anonymous_namespace)::CWriter::MangleName_abi_cxx11_
              (&local_a0,(CWriter *)local_50._M_string_length,name_00);
    std::operator+(&local_80,"var_",&local_a0);
    proposed_name._M_len._4_4_ = local_80._M_dataplus._M_p._4_4_;
    proposed_name._M_len._0_4_ = (uint)local_80._M_dataplus._M_p;
    proposed_name._M_str = in_R8;
    FindUniqueName(&local_c0,(CWriter *)&this->local_syms_,
                   (SymbolSet *)
                   CONCAT44(local_80._M_string_length._4_4_,(Index)local_80._M_string_length),
                   proposed_name);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    local_80._M_dataplus._M_p._4_4_ = type.enum_;
    local_80._M_string_length._0_4_ = type.type_index_;
    local_80._M_dataplus._M_p._0_4_ = __val;
    pVar6 = std::
            _Rb_tree<std::pair<unsigned_int,wabt::Type>,std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>>,std::less<std::pair<unsigned_int,wabt::Type>>,std::allocator<std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<unsigned_int,wabt::Type>&,std::__cxx11::string&>
                      ((_Rb_tree<std::pair<unsigned_int,wabt::Type>,std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>>,std::less<std::pair<unsigned_int,wabt::Type>>,std::allocator<std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>>>
                        *)&this->stack_var_sym_map_,(pair<unsigned_int,_wabt::Type> *)&local_80,
                       &local_c0);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("success",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x3fc,
                    "std::string wabt::(anonymous namespace)::CWriter::DefineStackVarName(Index, Type, std::string_view)"
                   );
    }
    WriteData(this,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  else {
    WriteData(this,(char *)iVar2._M_node[1]._M_left,(size_t)iVar2._M_node[1]._M_right);
  }
  return;
}

Assistant:

void CWriter::Write(const StackVar& sv) {
  Index index = type_stack_.size() - 1 - sv.index;
  Type type = sv.type;
  if (type == Type::Any) {
    assert(index < type_stack_.size());
    type = type_stack_[index];
  }

  StackTypePair stp = {index, type};
  auto iter = stack_var_sym_map_.find(stp);
  if (iter == stack_var_sym_map_.end()) {
    std::string name = MangleType(type) + std::to_string(index);
    Write(DefineStackVarName(index, type, name));
  } else {
    Write(iter->second);
  }
}